

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_write_sine.c
# Opt level: O1

int main(void)

{
  FILE *__stream;
  uint uVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  double dVar11;
  PaStream *stream;
  PaStreamParameters outputParameters;
  float sine [200];
  float buffer [1024] [2];
  PaStream *local_2388;
  int local_237c;
  PaStreamParameters local_2378;
  float afStack_2358 [200];
  float local_2038 [2050];
  
  lVar5 = 0;
  printf("PortAudio Test: output sine wave. SR = %d, BufSize = %d\n",0xac44,0x400);
  do {
    dVar11 = ((double)(int)lVar5 / 200.0) * 3.141592653589793;
    dVar11 = sin(dVar11 + dVar11);
    afStack_2358[lVar5] = (float)dVar11;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 200);
  uVar1 = Pa_Initialize();
  if (uVar1 == 0) {
    local_2378.device = Pa_GetDefaultOutputDevice();
    if (local_2378.device == -1) {
      main_cold_1();
      uVar10 = 0;
      goto LAB_00107fe7;
    }
    local_2378.channelCount = 2;
    local_2378.sampleFormat = 1;
    local_2378.suggestedLatency = 0.05;
    iVar9 = 0;
    local_2378.hostApiSpecificStreamInfo = (void *)0x0;
    uVar1 = Pa_OpenStream(&local_2388,(PaStreamParameters *)0x0,&local_2378,44100.0,0x400,1,
                          (PaStreamCallback *)0x0,(void *)0x0);
    if (uVar1 == 0) {
      puts("Play 3 times, higher each time.");
      iVar7 = 1;
      iVar8 = 3;
      iVar6 = 0;
      do {
        uVar1 = Pa_StartStream(local_2388);
        if (uVar1 != 0) goto LAB_00107fe4;
        printf("Play for %d seconds.\n",5);
        iVar2 = 0;
        do {
          lVar5 = 0;
          do {
            local_2038[lVar5 * 2] = afStack_2358[iVar6];
            iVar4 = iVar6 + iVar7;
            iVar6 = iVar4 + -200;
            if (iVar4 < 200) {
              iVar6 = iVar4;
            }
            local_2038[lVar5 * 2 + 1] = afStack_2358[iVar9];
            iVar4 = iVar9 + iVar8;
            iVar9 = iVar4 + -200;
            if (iVar4 < 200) {
              iVar9 = iVar4;
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 != 0x400);
          local_237c = iVar2;
          uVar1 = Pa_WriteStream(local_2388,local_2038,0x400);
          if (uVar1 != 0) goto LAB_00107fe4;
          iVar2 = local_237c + 1;
        } while (iVar2 != 0xd7);
        uVar1 = Pa_StopStream(local_2388);
        if (uVar1 != 0) goto LAB_00107fe4;
        iVar7 = iVar7 + 1;
        iVar8 = iVar8 + 1;
        Pa_Sleep(1000);
      } while (iVar8 != 6);
      uVar1 = Pa_CloseStream(local_2388);
      if (uVar1 == 0) {
        Pa_Terminate();
        puts("Test finished.");
        return 0;
      }
    }
  }
LAB_00107fe4:
  uVar10 = (ulong)uVar1;
LAB_00107fe7:
  fwrite("An error occured while using the portaudio stream\n",0x32,1,_stderr);
  iVar9 = (int)uVar10;
  fprintf(_stderr,"Error number: %d\n",uVar10);
  __stream = _stderr;
  pcVar3 = Pa_GetErrorText(iVar9);
  fprintf(__stream,"Error message: %s\n",pcVar3);
  if (iVar9 == -9999) {
    main_cold_2();
  }
  Pa_Terminate();
  return iVar9;
}

Assistant:

int main(void)
{
    PaStreamParameters outputParameters;
    PaStream *stream;
    PaError err;
    float buffer[FRAMES_PER_BUFFER][2]; /* stereo output buffer */
    float sine[TABLE_SIZE]; /* sine wavetable */
    int left_phase = 0;
    int right_phase = 0;
    int left_inc = 1;
    int right_inc = 3; /* higher pitch so we can distinguish left and right. */
    int i, j, k;
    int bufferCount;
    
    printf("PortAudio Test: output sine wave. SR = %d, BufSize = %d\n", SAMPLE_RATE, FRAMES_PER_BUFFER);
    
    /* initialise sinusoidal wavetable */
    for( i=0; i<TABLE_SIZE; i++ )
    {
        sine[i] = (float) sin( ((double)i/(double)TABLE_SIZE) * M_PI * 2. );
    }

    
    err = Pa_Initialize();
    if( err != paNoError ) goto error;

    outputParameters.device = Pa_GetDefaultOutputDevice(); /* default output device */
    if (outputParameters.device == paNoDevice) {
      fprintf(stderr,"Error: No default output device.\n");
      goto error;
    }
    outputParameters.channelCount = 2;       /* stereo output */
    outputParameters.sampleFormat = paFloat32; /* 32 bit floating point output */
    outputParameters.suggestedLatency = 0.050; // Pa_GetDeviceInfo( outputParameters.device )->defaultLowOutputLatency;
    outputParameters.hostApiSpecificStreamInfo = NULL;

    err = Pa_OpenStream(
              &stream,
              NULL, /* no input */
              &outputParameters,
              SAMPLE_RATE,
              FRAMES_PER_BUFFER,
              paClipOff,      /* we won't output out of range samples so don't bother clipping them */
              NULL, /* no callback, use blocking API */
              NULL ); /* no callback, so no callback userData */
    if( err != paNoError ) goto error;


    printf( "Play 3 times, higher each time.\n" );
    
    for( k=0; k < 3; ++k )
    {
        err = Pa_StartStream( stream );
        if( err != paNoError ) goto error;

        printf("Play for %d seconds.\n", NUM_SECONDS );

        bufferCount = ((NUM_SECONDS * SAMPLE_RATE) / FRAMES_PER_BUFFER);

        for( i=0; i < bufferCount; i++ )
        {
            for( j=0; j < FRAMES_PER_BUFFER; j++ )
            {
                buffer[j][0] = sine[left_phase];  /* left */
                buffer[j][1] = sine[right_phase];  /* right */
                left_phase += left_inc;
                if( left_phase >= TABLE_SIZE ) left_phase -= TABLE_SIZE;
                right_phase += right_inc;
                if( right_phase >= TABLE_SIZE ) right_phase -= TABLE_SIZE;
            }

            err = Pa_WriteStream( stream, buffer, FRAMES_PER_BUFFER );
            if( err != paNoError ) goto error;
        }   

        err = Pa_StopStream( stream );
        if( err != paNoError ) goto error;

        ++left_inc;
        ++right_inc;

        Pa_Sleep( 1000 );
    }

    err = Pa_CloseStream( stream );
    if( err != paNoError ) goto error;

    Pa_Terminate();
    printf("Test finished.\n");
    
    return err;

error:
    fprintf( stderr, "An error occured while using the portaudio stream\n" );
    fprintf( stderr, "Error number: %d\n", err );
    fprintf( stderr, "Error message: %s\n", Pa_GetErrorText( err ) );
	// Print more information about the error.
	if( err == paUnanticipatedHostError )
	{
		const PaHostErrorInfo *hostErrorInfo = Pa_GetLastHostErrorInfo();
		fprintf( stderr, "Host API error = #%ld, hostApiType = %d\n", hostErrorInfo->errorCode, hostErrorInfo->hostApiType );
		fprintf( stderr, "Host API error = %s\n", hostErrorInfo->errorText );
	}
    Pa_Terminate();
    return err;
}